

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O3

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseNumber<160u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          GenericStringStream<rapidjson::UTF8<char>_> *is,
          GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          *handler)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  Ch *pCVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  long lVar9;
  double *pdVar10;
  ulong i;
  byte bVar11;
  ulong uVar12;
  uint i_00;
  int iVar13;
  uint uVar14;
  byte *pbVar15;
  byte *pbVar16;
  int iVar17;
  double dVar18;
  double dVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  
  pbVar3 = (byte *)is->src_;
  bVar2 = *pbVar3;
  pbVar16 = pbVar3;
  bVar11 = bVar2;
  if (bVar2 == 0x2d) {
    pbVar16 = pbVar3 + 1;
    bVar11 = pbVar3[1];
  }
  pCVar4 = is->head_;
  if (bVar11 == 0x30) {
    uVar14 = (uint)pbVar16[1];
    pbVar15 = pbVar16 + 1;
    dVar18 = 0.0;
    bVar7 = false;
    i = 0;
    bVar6 = false;
    iVar8 = 0;
    bVar5 = false;
    i_00 = 0;
    goto LAB_001395ea;
  }
  if ((byte)(bVar11 - 0x31) < 9) {
    i_00 = bVar11 - 0x30;
    bVar11 = pbVar16[1];
    uVar12 = (ulong)bVar11;
    pbVar15 = pbVar16 + 1;
    dVar18 = 0.0;
    if (bVar2 == 0x2d) {
      if ((byte)(bVar11 - 0x30) < 10) {
        iVar8 = 0;
LAB_0013945e:
        if (i_00 < 0xccccccc) {
LAB_00139466:
          i_00 = (i_00 * 10 + (int)uVar12) - 0x30;
          iVar8 = iVar8 + 1;
          bVar11 = pbVar15[1];
          uVar12 = (ulong)bVar11;
          pbVar15 = pbVar15 + 1;
          if (9 < (byte)(bVar11 - 0x30)) goto LAB_00139532;
          goto LAB_0013945e;
        }
        if (i_00 != 0xccccccc) goto LAB_001394d5;
        if ((byte)uVar12 < 0x39) goto LAB_00139466;
        i_00 = 0xccccccc;
        uVar12 = 0x39;
LAB_001394d5:
        i = (ulong)i_00;
        if (bVar2 == 0x2d) {
          do {
            if ((0xccccccccccccccb < i) && (0x38 < (byte)uVar12 || i != 0xccccccccccccccc))
            goto LAB_00139582;
            i = (uVar12 & 0xf) + i * 10;
            iVar8 = iVar8 + 1;
            bVar11 = pbVar15[1];
            uVar12 = (ulong)bVar11;
            pbVar15 = pbVar15 + 1;
          } while ((byte)(bVar11 - 0x30) < 10);
        }
        else {
          do {
            if ((0x1999999999999998 < i) && (0x35 < (byte)uVar12 || i != 0x1999999999999999))
            goto LAB_00139582;
            i = (uVar12 & 0xf) + i * 10;
            iVar8 = iVar8 + 1;
            bVar11 = pbVar15[1];
            uVar12 = (ulong)bVar11;
            pbVar15 = pbVar15 + 1;
          } while ((byte)(bVar11 - 0x30) < 10);
        }
        uVar14 = (uint)bVar11;
        dVar18 = 0.0;
        bVar5 = true;
        bVar7 = false;
        bVar6 = false;
        goto LAB_001395ea;
      }
LAB_001399ab:
      iVar8 = 0;
    }
    else {
      if (9 < (byte)(bVar11 - 0x30)) goto LAB_001399ab;
      iVar8 = 0;
      do {
        if (0x19999998 < i_00) {
          if (i_00 != 0x19999999) goto LAB_001394d5;
          if (0x35 < (byte)uVar12) {
            i_00 = 0x19999999;
            goto LAB_001394d5;
          }
        }
        i_00 = (i_00 * 10 + (int)uVar12) - 0x30;
        iVar8 = iVar8 + 1;
        bVar11 = pbVar15[1];
        uVar12 = (ulong)bVar11;
        pbVar15 = pbVar15 + 1;
      } while ((byte)(bVar11 - 0x30) < 10);
    }
LAB_00139532:
    uVar14 = (uint)bVar11;
    i = 0;
    bVar6 = false;
    bVar7 = false;
    bVar5 = false;
    goto LAB_001395ea;
  }
  lVar9 = (long)pbVar16 - (long)pCVar4;
  *(undefined4 *)(this + 0x30) = 3;
  goto LAB_00139813;
LAB_001397ee:
  do {
    pbVar16 = pbVar15 + 1;
    pbVar15 = pbVar15 + 1;
  } while ((byte)(*pbVar16 - 0x30) < 10);
LAB_0013986e:
  iVar8 = -iVar17;
  if (!bVar7) {
    iVar8 = iVar17;
  }
LAB_0013987b:
  if (bVar6) {
LAB_00139880:
    uVar14 = iVar8 + iVar13;
    if ((int)uVar14 < -0x134) {
      dVar19 = 0.0;
      if (0xfffffd97 < uVar14) {
        dVar19 = dVar18 / (*(double *)(internal::Pow10(int)::e + (ulong)(-uVar14 - 0x134) * 8) *
                          1e+308);
        goto LAB_00139937;
      }
    }
    else {
      if ((int)uVar14 < 0) {
        dVar19 = dVar18 / *(double *)(internal::Pow10(int)::e + (ulong)-uVar14 * 8);
      }
      else {
        dVar19 = dVar18 * *(double *)(internal::Pow10(int)::e + (ulong)uVar14 * 8);
      }
LAB_00139937:
      if (1.79769313486232e+308 < dVar19) goto LAB_00139945;
    }
    if (bVar2 == 0x2d) {
      dVar19 = -dVar19;
    }
    pdVar10 = (double *)(handler->stack_).stackTop_;
    if ((long)(handler->stack_).stackEnd_ - (long)pdVar10 < 0x10) {
      internal::Stack<rapidjson::CrtAllocator>::
      Expand<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                (&handler->stack_,1);
      pdVar10 = (double *)(handler->stack_).stackTop_;
    }
    (handler->stack_).stackTop_ = (char *)(pdVar10 + 2);
    pdVar10[1] = 1.3140351748525322e-298;
    *pdVar10 = dVar19;
    pbVar16 = pbVar15;
    goto LAB_00139995;
  }
  if (bVar5) {
    if (bVar2 == 0x2d) {
      bVar7 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
              ::Int64(handler,-i);
    }
    else {
      bVar7 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
              ::Uint64(handler,i);
    }
  }
  else if (bVar2 == 0x2d) {
    bVar7 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
            ::Int(handler,-i_00);
  }
  else {
    bVar7 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
            ::Uint(handler,i_00);
  }
  pbVar16 = pbVar15;
  if (bVar7 != false) goto LAB_00139995;
  *(undefined4 *)(this + 0x30) = 0x10;
LAB_00139951:
  *(long *)(this + 0x38) = (long)pbVar3 - (long)pCVar4;
  pbVar16 = pbVar15;
  goto LAB_00139995;
LAB_00139582:
  auVar20._8_4_ = (int)(i >> 0x20);
  auVar20._0_8_ = i;
  auVar20._12_4_ = 0x45300000;
  dVar18 = (auVar20._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)i) - 4503599627370496.0);
  do {
    dVar18 = (double)((int)uVar12 + -0x30) + dVar18 * 10.0;
    bVar11 = pbVar15[1];
    uVar12 = (ulong)bVar11;
    uVar14 = (uint)bVar11;
    pbVar15 = pbVar15 + 1;
  } while ((byte)(bVar11 - 0x30) < 10);
  bVar7 = true;
  bVar6 = true;
  bVar5 = true;
LAB_001395ea:
  if ((char)uVar14 != '.') {
    iVar13 = 0;
LAB_0013972b:
    iVar8 = 0;
    if ((uVar14 | 0x20) != 0x65) goto LAB_0013987b;
    uVar12 = (ulong)i_00;
    if (bVar5) {
      uVar12 = i;
    }
    if (!bVar6) {
      auVar22._8_4_ = (int)(uVar12 >> 0x20);
      auVar22._0_8_ = uVar12;
      auVar22._12_4_ = 0x45300000;
      dVar18 = (auVar22._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar12) - 4503599627370496.0);
      bVar6 = true;
    }
    bVar11 = pbVar15[1];
    bVar7 = bVar11 != 0x2b;
    if ((bVar7) && (bVar11 != 0x2d)) {
      if (9 < (byte)(bVar11 - 0x30)) {
        pbVar16 = pbVar15 + 1;
LAB_00139801:
        lVar9 = (long)pbVar16 - (long)pCVar4;
        *(undefined4 *)(this + 0x30) = 0xf;
        goto LAB_00139813;
      }
      pbVar15 = pbVar15 + 2;
      iVar17 = bVar11 - 0x30;
    }
    else {
      pbVar16 = pbVar15 + 2;
      if (9 < (byte)(*pbVar16 - 0x30)) {
        pbVar16 = pbVar15 + 2;
        goto LAB_00139801;
      }
      pbVar15 = pbVar15 + 3;
      iVar17 = *pbVar16 - 0x30;
      if (bVar11 != 0x2b) {
        bVar11 = *pbVar15;
        if ((byte)(bVar11 - 0x30) < 10) {
          do {
            iVar17 = iVar17 * 10 + (uint)bVar11 + -0x30;
            if ((iVar13 + 0x7ffffff7) / 10 < iVar17) goto LAB_001397ee;
            pbVar15 = pbVar15 + 1;
            bVar11 = *pbVar15;
          } while ((byte)(bVar11 - 0x30) < 10);
        }
        else {
          bVar7 = true;
        }
        goto LAB_0013986e;
      }
    }
    do {
      bVar11 = *pbVar15;
      if (9 < (byte)(bVar11 - 0x30)) {
        bVar7 = false;
        goto LAB_0013986e;
      }
      pbVar15 = pbVar15 + 1;
      iVar17 = iVar17 * 10 + (uint)bVar11 + -0x30;
    } while (iVar17 <= 0x134 - iVar13);
LAB_00139945:
    *(undefined4 *)(this + 0x30) = 0xd;
    goto LAB_00139951;
  }
  uVar14 = (uint)pbVar15[1];
  pbVar16 = pbVar15 + 1;
  if (0xf5 < (byte)(pbVar15[1] - 0x3a)) {
    iVar13 = 0;
    if (bVar7) {
LAB_00139698:
      do {
        pbVar15 = pbVar16;
        if (0x39 < (byte)uVar14) goto LAB_0013972b;
        if (iVar8 < 0x11) {
          dVar18 = (double)(int)(uVar14 - 0x30) + dVar18 * 10.0;
          iVar13 = iVar13 + -1;
          if (0.0 < dVar18) {
            iVar8 = iVar8 + 1;
          }
        }
        pbVar1 = pbVar16 + 1;
        uVar14 = (uint)*pbVar1;
        pbVar15 = pbVar16 + 1;
        pbVar16 = pbVar15;
      } while ('/' < (char)*pbVar1);
      iVar8 = 0;
      goto LAB_0013987b;
    }
    if (!bVar5) {
      i = (ulong)i_00;
    }
    iVar13 = 0;
    do {
      if ((0x39 < (byte)uVar14) || (i >> 0x35 != 0)) {
        auVar21._8_4_ = (int)(i >> 0x20);
        auVar21._0_8_ = i;
        auVar21._12_4_ = 0x45300000;
        dVar18 = (auVar21._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)i) - 4503599627370496.0);
        bVar6 = true;
        goto LAB_00139698;
      }
      pbVar15 = pbVar16 + 1;
      iVar13 = iVar13 + -1;
      i = (ulong)(uVar14 - 0x30) + i * 10;
      iVar8 = iVar8 + (uint)(i != 0);
      pbVar1 = pbVar16 + 1;
      uVar14 = (uint)*pbVar1;
      pbVar16 = pbVar15;
    } while ('/' < (char)*pbVar1);
    dVar18 = (double)(long)i;
    iVar8 = 0;
    goto LAB_00139880;
  }
  lVar9 = (long)pbVar16 - (long)pCVar4;
  *(undefined4 *)(this + 0x30) = 0xe;
LAB_00139813:
  *(long *)(this + 0x38) = lVar9;
LAB_00139995:
  is->src_ = (Ch *)pbVar16;
  is->head_ = pCVar4;
  return;
}

Assistant:

void ParseNumber(InputStream& is, Handler& handler) {
        internal::StreamLocalCopy<InputStream> copy(is);
        NumberStream<InputStream,
            ((parseFlags & kParseNumbersAsStringsFlag) != 0) ?
                ((parseFlags & kParseInsituFlag) == 0) :
                ((parseFlags & kParseFullPrecisionFlag) != 0),
            (parseFlags & kParseNumbersAsStringsFlag) != 0 &&
                (parseFlags & kParseInsituFlag) == 0> s(*this, copy.s);

        size_t startOffset = s.Tell();
        double d = 0.0;
        bool useNanOrInf = false;

        // Parse minus
        bool minus = Consume(s, '-');

        // Parse int: zero / ( digit1-9 *DIGIT )
        unsigned i = 0;
        uint64_t i64 = 0;
        bool use64bit = false;
        int significandDigit = 0;
        if (RAPIDJSON_UNLIKELY(s.Peek() == '0')) {
            i = 0;
            s.TakePush();
        }
        else if (RAPIDJSON_LIKELY(s.Peek() >= '1' && s.Peek() <= '9')) {
            i = static_cast<unsigned>(s.TakePush() - '0');

            if (minus)
                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                    if (RAPIDJSON_UNLIKELY(i >= 214748364)) { // 2^31 = 2147483648
                        if (RAPIDJSON_LIKELY(i != 214748364 || s.Peek() > '8')) {
                            i64 = i;
                            use64bit = true;
                            break;
                        }
                    }
                    i = i * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
            else
                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                    if (RAPIDJSON_UNLIKELY(i >= 429496729)) { // 2^32 - 1 = 4294967295
                        if (RAPIDJSON_LIKELY(i != 429496729 || s.Peek() > '5')) {
                            i64 = i;
                            use64bit = true;
                            break;
                        }
                    }
                    i = i * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
        }
        // Parse NaN or Infinity here
        else if ((parseFlags & kParseNanAndInfFlag) && RAPIDJSON_LIKELY((s.Peek() == 'I' || s.Peek() == 'N'))) {
            if (Consume(s, 'N')) {
                if (Consume(s, 'a') && Consume(s, 'N')) {
                    d = std::numeric_limits<double>::quiet_NaN();
                    useNanOrInf = true;
                }
            }
            else if (RAPIDJSON_LIKELY(Consume(s, 'I'))) {
                if (Consume(s, 'n') && Consume(s, 'f')) {
                    d = (minus ? -std::numeric_limits<double>::infinity() : std::numeric_limits<double>::infinity());
                    useNanOrInf = true;

                    if (RAPIDJSON_UNLIKELY(s.Peek() == 'i' && !(Consume(s, 'i') && Consume(s, 'n')
                                                                && Consume(s, 'i') && Consume(s, 't') && Consume(s, 'y')))) {
                        RAPIDJSON_PARSE_ERROR(kParseErrorValueInvalid, s.Tell());
                    }
                }
            }

            if (RAPIDJSON_UNLIKELY(!useNanOrInf)) {
                RAPIDJSON_PARSE_ERROR(kParseErrorValueInvalid, s.Tell());
            }
        }
        else
            RAPIDJSON_PARSE_ERROR(kParseErrorValueInvalid, s.Tell());

        // Parse 64bit int
        bool useDouble = false;
        if (use64bit) {
            if (minus)
                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                     if (RAPIDJSON_UNLIKELY(i64 >= RAPIDJSON_UINT64_C2(0x0CCCCCCC, 0xCCCCCCCC))) // 2^63 = 9223372036854775808
                        if (RAPIDJSON_LIKELY(i64 != RAPIDJSON_UINT64_C2(0x0CCCCCCC, 0xCCCCCCCC) || s.Peek() > '8')) {
                            d = static_cast<double>(i64);
                            useDouble = true;
                            break;
                        }
                    i64 = i64 * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
            else
                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                    if (RAPIDJSON_UNLIKELY(i64 >= RAPIDJSON_UINT64_C2(0x19999999, 0x99999999))) // 2^64 - 1 = 18446744073709551615
                        if (RAPIDJSON_LIKELY(i64 != RAPIDJSON_UINT64_C2(0x19999999, 0x99999999) || s.Peek() > '5')) {
                            d = static_cast<double>(i64);
                            useDouble = true;
                            break;
                        }
                    i64 = i64 * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
        }

        // Force double for big integer
        if (useDouble) {
            while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                d = d * 10 + (s.TakePush() - '0');
            }
        }

        // Parse frac = decimal-point 1*DIGIT
        int expFrac = 0;
        size_t decimalPosition;
        if (Consume(s, '.')) {
            decimalPosition = s.Length();

            if (RAPIDJSON_UNLIKELY(!(s.Peek() >= '0' && s.Peek() <= '9')))
                RAPIDJSON_PARSE_ERROR(kParseErrorNumberMissFraction, s.Tell());

            if (!useDouble) {
#if RAPIDJSON_64BIT
                // Use i64 to store significand in 64-bit architecture
                if (!use64bit)
                    i64 = i;

                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                    if (i64 > RAPIDJSON_UINT64_C2(0x1FFFFF, 0xFFFFFFFF)) // 2^53 - 1 for fast path
                        break;
                    else {
                        i64 = i64 * 10 + static_cast<unsigned>(s.TakePush() - '0');
                        --expFrac;
                        if (i64 != 0)
                            significandDigit++;
                    }
                }

                d = static_cast<double>(i64);
#else
                // Use double to store significand in 32-bit architecture
                d = static_cast<double>(use64bit ? i64 : i);
#endif
                useDouble = true;
            }

            while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                if (significandDigit < 17) {
                    d = d * 10.0 + (s.TakePush() - '0');
                    --expFrac;
                    if (RAPIDJSON_LIKELY(d > 0.0))
                        significandDigit++;
                }
                else
                    s.TakePush();
            }
        }
        else
            decimalPosition = s.Length(); // decimal position at the end of integer.

        // Parse exp = e [ minus / plus ] 1*DIGIT
        int exp = 0;
        if (Consume(s, 'e') || Consume(s, 'E')) {
            if (!useDouble) {
                d = static_cast<double>(use64bit ? i64 : i);
                useDouble = true;
            }

            bool expMinus = false;
            if (Consume(s, '+'))
                ;
            else if (Consume(s, '-'))
                expMinus = true;

            if (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                exp = static_cast<int>(s.Take() - '0');
                if (expMinus) {
                    // (exp + expFrac) must not underflow int => we're detecting when -exp gets
                    // dangerously close to INT_MIN (a pessimistic next digit 9 would push it into
                    // underflow territory):
                    //
                    //        -(exp * 10 + 9) + expFrac >= INT_MIN
                    //   <=>  exp <= (expFrac - INT_MIN - 9) / 10
                    RAPIDJSON_ASSERT(expFrac <= 0);
                    int maxExp = (expFrac + 2147483639) / 10;

                    while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                        exp = exp * 10 + static_cast<int>(s.Take() - '0');
                        if (RAPIDJSON_UNLIKELY(exp > maxExp)) {
                            while (RAPIDJSON_UNLIKELY(s.Peek() >= '0' && s.Peek() <= '9'))  // Consume the rest of exponent
                                s.Take();
                        }
                    }
                }
                else {  // positive exp
                    int maxExp = 308 - expFrac;
                    while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                        exp = exp * 10 + static_cast<int>(s.Take() - '0');
                        if (RAPIDJSON_UNLIKELY(exp > maxExp))
                            RAPIDJSON_PARSE_ERROR(kParseErrorNumberTooBig, startOffset);
                    }
                }
            }
            else
                RAPIDJSON_PARSE_ERROR(kParseErrorNumberMissExponent, s.Tell());

            if (expMinus)
                exp = -exp;
        }

        // Finish parsing, call event according to the type of number.
        bool cont = true;

        if (parseFlags & kParseNumbersAsStringsFlag) {
            if (parseFlags & kParseInsituFlag) {
                s.Pop();  // Pop stack no matter if it will be used or not.
                typename InputStream::Ch* head = is.PutBegin();
                const size_t length = s.Tell() - startOffset;
                RAPIDJSON_ASSERT(length <= 0xFFFFFFFF);
                // unable to insert the \0 character here, it will erase the comma after this number
                const typename TargetEncoding::Ch* const str = reinterpret_cast<typename TargetEncoding::Ch*>(head);
                cont = handler.RawNumber(str, SizeType(length), false);
            }
            else {
                SizeType numCharsToCopy = static_cast<SizeType>(s.Length());
                StringStream srcStream(s.Pop());
                StackStream<typename TargetEncoding::Ch> dstStream(stack_);
                while (numCharsToCopy--) {
                    Transcoder<UTF8<>, TargetEncoding>::Transcode(srcStream, dstStream);
                }
                dstStream.Put('\0');
                const typename TargetEncoding::Ch* str = dstStream.Pop();
                const SizeType length = static_cast<SizeType>(dstStream.Length()) - 1;
                cont = handler.RawNumber(str, SizeType(length), true);
            }
        }
        else {
           size_t length = s.Length();
           const char* decimal = s.Pop();  // Pop stack no matter if it will be used or not.

           if (useDouble) {
               int p = exp + expFrac;
               if (parseFlags & kParseFullPrecisionFlag)
                   d = internal::StrtodFullPrecision(d, p, decimal, length, decimalPosition, exp);
               else
                   d = internal::StrtodNormalPrecision(d, p);

               // Use > max, instead of == inf, to fix bogus warning -Wfloat-equal
               if (d > (std::numeric_limits<double>::max)()) {
                   // Overflow
                   // TODO: internal::StrtodX should report overflow (or underflow)
                   RAPIDJSON_PARSE_ERROR(kParseErrorNumberTooBig, startOffset);
               }

               cont = handler.Double(minus ? -d : d);
           }
           else if (useNanOrInf) {
               cont = handler.Double(d);
           }
           else {
               if (use64bit) {
                   if (minus)
                       cont = handler.Int64(static_cast<int64_t>(~i64 + 1));
                   else
                       cont = handler.Uint64(i64);
               }
               else {
                   if (minus)
                       cont = handler.Int(static_cast<int32_t>(~i + 1));
                   else
                       cont = handler.Uint(i);
               }
           }
        }
        if (RAPIDJSON_UNLIKELY(!cont))
            RAPIDJSON_PARSE_ERROR(kParseErrorTermination, startOffset);
    }